

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O1

void __thiscall
OpenMD::InteractionManager::doSelfCorrection(InteractionManager *this,SelfData *sdat)

{
  element_type *peVar1;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  if ((*(byte *)((this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sdat->atid) & 1) == 0) {
    return;
  }
  peVar1 = (this->electrostatic_).
           super___shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ElectrostaticInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
    [7])(peVar1,sdat);
  return;
}

Assistant:

void InteractionManager::doSelfCorrection(SelfData& sdat) {
    if (!initialized_) initialize();

    int& sHash = sHash_[sdat.atid];

    if ((sHash & ELECTROSTATIC_INTERACTION) != 0) {
      electrostatic_->calcSelfCorrection(sdat);
    }

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[atid1][atid2].begin();
    //      it != interactions_[atid1][atid2].end(); ++it){
    //   if ((*it)->getFamily() == ELECTROSTATIC_FAMILY) {
    //     dynamic_cast<ElectrostaticInteraction*>(*it)->calcSelfCorrection(sdat);
    //   }
    // }

    return;
  }